

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3OnePass(int iters,char *regexp,StringPiece *text)

{
  Prog *pPVar1;
  bool bVar2;
  ostream *poVar3;
  StringPiece *local_6d0;
  LogMessage local_698;
  undefined1 local_518 [8];
  StringPiece sp [4];
  LogMessage local_358;
  Prog *local_1d8;
  Prog *prog;
  LogMessage local_1c0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  StringPiece *pSStack_20;
  int i;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_40,(char *)text_local);
    local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)0x0);
    if (local_30 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x429);
      poVar3 = LogMessage::stream(&local_1c0);
      std::operator<<(poVar3,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
    }
    local_1d8 = Regexp::CompileToProg(local_30,0);
    if (local_1d8 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42b);
      poVar3 = LogMessage::stream(&local_358);
      std::operator<<(poVar3,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_358);
    }
    bVar2 = Prog::IsOnePass(local_1d8);
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp[3].length_,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42c);
      poVar3 = LogMessage::stream((LogMessage *)&sp[3].length_);
      std::operator<<(poVar3,"Check failed: prog->IsOnePass()");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp[3].length_);
    }
    local_6d0 = (StringPiece *)local_518;
    do {
      StringPiece::StringPiece(local_6d0);
      local_6d0 = local_6d0 + 1;
    } while (local_6d0 != (StringPiece *)&sp[3].length_);
    bVar2 = Prog::SearchOnePass(local_1d8,pSStack_20,pSStack_20,kAnchored,kFullMatch,
                                (StringPiece *)local_518,4);
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_698,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42e);
      poVar3 = LogMessage::stream(&local_698);
      std::operator<<(poVar3,
                      "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_698);
    }
    pPVar1 = local_1d8;
    if (local_1d8 != (Prog *)0x0) {
      Prog::~Prog(local_1d8);
      operator_delete(pPVar1);
    }
    Regexp::Decref(local_30);
  }
  return;
}

Assistant:

void Parse3OnePass(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    StringPiece sp[4];  // 4 because sp[0] is whole match.
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    delete prog;
    re->Decref();
  }
}